

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O1

json __thiscall jsonrpccxx::Dispatcher::InvokeMethod(Dispatcher *this,string *name,json *params)

{
  iterator iVar1;
  JsonRpcException *this_00;
  json_value extraout_RDX;
  json jVar2;
  
  iVar1 = std::_Rb_tree<$b1aadcda$>::find((_Rb_tree<_b1aadcda_> *)name,(key_type *)params);
  if (iVar1._M_node == (_Base_ptr)&name->_M_string_length) {
    this_00 = (JsonRpcException *)__cxa_allocate_exception(0x60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff90,"method not found: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params);
    JsonRpcException::JsonRpcException(this_00,-0x7f59,(string *)&stack0xffffffffffffff90);
    __cxa_throw(this_00,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
  }
  normalize_parameter((Dispatcher *)&stack0xffffffffffffff90,name,params);
  if (iVar1._M_node[2]._M_left != (_Base_ptr)0x0) {
    (*(code *)iVar1._M_node[2]._M_right)(this,iVar1._M_node + 2,&stack0xffffffffffffff90);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&stack0xffffffffffffff90);
    jVar2.m_value.object = extraout_RDX.object;
    jVar2._0_8_ = this;
    return jVar2;
  }
  std::__throw_bad_function_call();
}

Assistant:

json InvokeMethod(const std::string &name, const json &params) {
      auto method = methods.find(name);
      if (method == methods.end()) {
        throw JsonRpcException(method_not_found, "method not found: " + name);
      }
      try {
        return method->second(normalize_parameter(name, params));
      } catch (json::type_error &e) {
        throw JsonRpcException(invalid_params, "invalid parameter: " + std::string(e.what()));
      } catch (JsonRpcException &e) {
        throw process_type_error(name, e);
      }
    }